

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderReuseTests<TestHeapBuilder,_TestHeapBuilder>::run_tests(TestSelector *selector)

{
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_e0;
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_b0;
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_80;
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  local_40;
  TestSelector *local_10;
  TestSelector *selector_local;
  
  local_10 = selector;
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::set(&local_40,selector);
  builder_reusable_after_release_test(&local_40);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~set(&local_40);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::set(&local_80,selector);
  builder_reusable_after_releaseraw_test(&local_80);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~set(&local_80);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::set(&local_b0,selector);
  builder_reusable_after_release_and_move_assign_test(&local_b0);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~set(&local_b0);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::set(&local_e0,selector);
  builder_reusable_after_releaseraw_and_move_assign_test(&local_e0);
  std::
  set<BuilderReuseTestSelector,_std::less<BuilderReuseTestSelector>,_std::allocator<BuilderReuseTestSelector>_>
  ::~set(&local_e0);
  return;
}

Assistant:

static void run_tests(TestSelector selector) {
    builder_reusable_after_release_test(selector);
    builder_reusable_after_releaseraw_test(selector);
    builder_reusable_after_release_and_move_assign_test(selector);
    builder_reusable_after_releaseraw_and_move_assign_test(selector);
  }